

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::subSatSI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    uVar1 = *(ushort *)&this->field_0;
    uVar3 = (ushort)(other->field_0).i32;
    uVar2 = uVar1 - uVar3;
    uVar4 = 0x7fff - ((short)uVar1 >> 0xf);
    if (-1 < (short)((uVar2 ^ uVar1) & (uVar3 ^ uVar1))) {
      uVar4 = uVar2;
    }
    *(int *)&__return_storage_ptr__->field_0 = (int)(short)uVar4;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::subSatSI16(const Literal& other) const {
  return Literal(sub_sat_s<int16_t>(geti32(), other.geti32()));
}